

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  pointer puVar5;
  string_view prefix;
  string_view str;
  string defaultName;
  undefined1 local_a0 [8];
  pointer local_98;
  pointer local_90;
  cmDocumentationEntry local_78;
  
  EvaluateDefaultGlobalGenerator((cmake *)local_a0);
  (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
               *)local_a0)->
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            )._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[3].
            _vptr_cmGlobalGeneratorFactory)(&local_98);
  puVar1 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (puVar5 = (this->Generators).
                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    (*((puVar5->_M_t).
       super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
       .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
      _vptr_cmGlobalGeneratorFactory[3])(&local_78);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
    emplace_back<cmDocumentationEntry>(v,&local_78);
    cmDocumentationEntry::~cmDocumentationEntry(&local_78);
    bVar3 = !bVar4;
    bVar4 = true;
    if (bVar3) {
      pcVar2 = (v->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      prefix._M_str = (char *)local_98;
      prefix._M_len = (size_t)local_90;
      str._M_str = pcVar2[-1].Name._M_dataplus._M_p;
      str._M_len = pcVar2[-1].Name._M_string_length;
      bVar3 = cmHasPrefix(str,prefix);
      if (bVar3) {
        (v->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>)._M_impl
        .super__Vector_impl_data._M_finish[-1].CustomNamePrefix = '*';
      }
      else {
        bVar4 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_98);
  if (local_a0 != (undefined1  [8])0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_a0)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const auto defaultName = defaultGenerator->GetName();
  auto foundDefaultOne = false;

  for (const auto& g : this->Generators) {
    v.emplace_back(g->GetDocumentation());
    if (!foundDefaultOne && cmHasPrefix(v.back().Name, defaultName)) {
      v.back().CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
  }
}